

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::ClearDependencies
          (cmLocalUnixMakefileGenerator3 *this,cmMakefile *mf,bool verbose)

{
  pointer pcVar1;
  char *__s;
  size_t sVar2;
  pointer filename;
  string dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string dependFile;
  string internalDependFile;
  cmDepends clearer;
  string local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  long *local_120 [2];
  long local_110 [2];
  string local_100;
  undefined1 local_e0 [48];
  bool local_b0;
  
  pcVar1 = local_e0 + 0x10;
  local_e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"CMAKE_DEPEND_INFO_FILES","");
  __s = cmMakefile::GetDefinition(mf,(string *)local_e0);
  if ((pointer)local_e0._0_8_ != pcVar1) {
    operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
  }
  if (__s != (char *)0x0) {
    local_138.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_138.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_138.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e0._0_8_ = pcVar1;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,__s,__s + sVar2);
    cmSystemTools::ExpandListArgument((string *)local_e0,&local_138,false);
    if ((pointer)local_e0._0_8_ != pcVar1) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
    }
    cmDepends::cmDepends((cmDepends *)local_e0,(cmLocalGenerator *)0x0,"");
    local_b0 = verbose;
    if (local_138.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_138.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      filename = local_138.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      do {
        cmsys::SystemTools::GetFilenamePath(&local_158,filename);
        local_120[0] = local_110;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_120,local_158._M_dataplus._M_p,
                   local_158._M_dataplus._M_p + local_158._M_string_length);
        std::__cxx11::string::append((char *)local_120);
        cmDepends::Clear((cmDepends *)local_e0,(char *)local_120[0]);
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_100,local_158._M_dataplus._M_p,
                   local_158._M_dataplus._M_p + local_158._M_string_length);
        std::__cxx11::string::append((char *)&local_100);
        cmsys::SystemTools::RemoveFile(&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        if (local_120[0] != local_110) {
          operator_delete(local_120[0],local_110[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        filename = filename + 1;
      } while (filename !=
               local_138.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    cmDepends::~cmDepends((cmDepends *)local_e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_138);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::ClearDependencies(cmMakefile* mf,
                                                      bool verbose)
{
  // Get the list of target files to check
  const char* infoDef = mf->GetDefinition("CMAKE_DEPEND_INFO_FILES");
  if(!infoDef)
    {
    return;
    }
  std::vector<std::string> files;
  cmSystemTools::ExpandListArgument(infoDef, files);

  // Each depend information file corresponds to a target.  Clear the
  // dependencies for that target.
  cmDepends clearer;
  clearer.SetVerbose(verbose);
  for(std::vector<std::string>::iterator l = files.begin();
      l != files.end(); ++l)
    {
    std::string dir = cmSystemTools::GetFilenamePath(*l);

    // Clear the implicit dependency makefile.
    std::string dependFile = dir + "/depend.make";
    clearer.Clear(dependFile.c_str());

    // Remove the internal dependency check file to force
    // regeneration.
    std::string internalDependFile = dir + "/depend.internal";
    cmSystemTools::RemoveFile(internalDependFile);
    }
}